

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_value.cpp
# Opt level: O0

ScalarFunction * duckdb::UnionValueFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  init_local_state_t unaff_retaddr;
  LogicalType *in_stack_00000008;
  FunctionStability in_stack_00000010;
  FunctionNullHandling in_stack_00000018;
  bind_lambda_function_t in_stack_00000020;
  ScalarFunction *fun;
  LogicalType *other;
  LogicalType *this;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffee8;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  *in_stack_fffffffffffffef0;
  LogicalTypeId in_stack_fffffffffffffeff;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffff04;
  bind_scalar_function_t in_stack_ffffffffffffffb8;
  scalar_function_t *in_stack_ffffffffffffffc0;
  LogicalType *in_stack_ffffffffffffffc8;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  ScalarFunction *in_stack_ffffffffffffffe0;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 uVar2;
  ScalarFunction *statistics;
  
  uVar2 = 0;
  statistics = in_RDI;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffd0,"union_value",(allocator *)&stack0xffffffffffffffcf)
  ;
  vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0x219f4c5);
  LogicalType::LogicalType
            ((LogicalType *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffeff);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  LogicalType::LogicalType
            ((LogicalType *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffeff);
  uVar1 = 0;
  this = (LogicalType *)0x0;
  other = (LogicalType *)0x0;
  ScalarFunction::ScalarFunction
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (bind_scalar_function_extended_t)CONCAT17(uVar2,in_stack_fffffffffffffff0),
             (function_statistics_t)statistics,unaff_retaddr,in_stack_00000008,in_stack_00000010,
             in_stack_00000018,in_stack_00000020);
  LogicalType::~LogicalType((LogicalType *)0x219f571);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x219f57e);
  LogicalType::~LogicalType((LogicalType *)0x219f58b);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x219f598);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  LogicalType::LogicalType
            ((LogicalType *)CONCAT44(in_stack_ffffffffffffff04,uVar1),in_stack_fffffffffffffeff);
  LogicalType::operator=(this,other);
  LogicalType::~LogicalType((LogicalType *)0x219f5e0);
  (in_RDI->super_BaseScalarFunction).null_handling = SPECIAL_HANDLING;
  in_RDI->serialize = VariableReturnBindData::Serialize;
  in_RDI->deserialize = VariableReturnBindData::Deserialize;
  return in_RDI;
}

Assistant:

ScalarFunction UnionValueFun::GetFunction() {
	ScalarFunction fun("union_value", {}, LogicalTypeId::UNION, UnionValueFunction, UnionValueBind, nullptr, nullptr);
	fun.varargs = LogicalType::ANY;
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	fun.serialize = VariableReturnBindData::Serialize;
	fun.deserialize = VariableReturnBindData::Deserialize;
	return fun;
}